

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O0

bool __thiscall
cmLoadCommandCommand::InitialPass
          (cmLoadCommandCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  const_reference pvVar3;
  char *pcVar4;
  size_type sVar5;
  ostream *poVar6;
  cmLoadedCommand *this_00;
  cmState *this_01;
  allocator local_399;
  string local_398;
  cmLoadedCommand *local_378;
  cmLoadedCommand *f;
  CM_INIT_FUNCTION initFunction;
  string initFuncName;
  char *error;
  allocator local_319;
  undefined1 local_318 [8];
  string err;
  LibraryHandle lib;
  string local_2e8;
  undefined1 local_2c8 [8];
  ostringstream e;
  undefined1 local_150 [8];
  string fullPath;
  string exp;
  undefined1 local_108 [4];
  uint j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  undefined1 local_80 [8];
  string moduleName;
  allocator local_49;
  undefined1 local_48 [8];
  string reportVar;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmLoadCommandCommand *this_local;
  
  reportVar.field_2._8_8_ = param_2;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_48,"CMAKE_LOADED_COMMAND_",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    std::__cxx11::string::operator+=((string *)local_48,(string *)pvVar3);
    cmMakefile::RemoveDefinition((this->super_cmCommand).Makefile,(string *)local_48);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"CMAKE_SHARED_MODULE_PREFIX",&local_a1);
    pcVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_80,pcVar4,&local_a2);
    std::allocator<char>::~allocator((allocator<char> *)&local_a2);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    std::operator+(&local_c8,"cm",pvVar3);
    std::__cxx11::string::operator+=((string *)local_80,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e8,"CMAKE_SHARED_MODULE_SUFFIX",
               (allocator *)
               ((long)&path.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_e8);
    std::__cxx11::string::operator+=((string *)local_80,pcVar4);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&path.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_108);
    exp.field_2._12_4_ = 1;
    while( true ) {
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args);
      if (sVar5 <= (uint)exp.field_2._12_4_) break;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)(uint)exp.field_2._12_4_);
      std::__cxx11::string::string((string *)(fullPath.field_2._M_local_buf + 8),(string *)pvVar3);
      cmSystemTools::ExpandRegistryValues((string *)((long)&fullPath.field_2 + 8),KeyWOW64_Default);
      cmSystemTools::GlobDirs
                ((string *)((long)&fullPath.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_108);
      std::__cxx11::string::~string((string *)(fullPath.field_2._M_local_buf + 8));
      exp.field_2._12_4_ = exp.field_2._12_4_ + 1;
    }
    cmsys::SystemTools::FindFile
              ((string *)local_150,(string *)local_80,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_108,false);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_150,"");
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
      poVar6 = std::operator<<((ostream *)local_2c8,"Attempt to load command failed from file \"");
      poVar6 = std::operator<<(poVar6,(string *)local_80);
      std::operator<<(poVar6,"\"");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      this_local._7_1_ = false;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      err.field_2._8_8_ = cmDynamicLoader::OpenLibrary(pcVar4);
      if ((LibraryHandle)err.field_2._8_8_ == (LibraryHandle)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_318,"Attempt to load the library ",&local_319);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150," failed.");
        std::__cxx11::string::operator+=((string *)local_318,(string *)&error);
        std::__cxx11::string::~string((string *)&error);
        initFuncName.field_2._8_8_ = cmsys::DynamicLoader::LastError();
        if ((char *)initFuncName.field_2._8_8_ != (char *)0x0) {
          std::__cxx11::string::operator+=((string *)local_318," Additional error info is:\n");
          std::__cxx11::string::operator+=((string *)local_318,(char *)initFuncName.field_2._8_8_);
        }
        cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
        this_local._7_1_ = false;
        std::__cxx11::string::~string((string *)local_318);
      }
      else {
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)local_48,pcVar4);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &initFunction,pvVar3,"Init");
        f = (cmLoadedCommand *)
            cmsys::DynamicLoader::GetSymbolAddress
                      ((LibraryHandle)err.field_2._8_8_,(string *)&initFunction);
        if (f == (cmLoadedCommand *)0x0) {
          std::__cxx11::string::operator=((string *)&initFunction,"_");
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,0);
          std::__cxx11::string::operator+=((string *)&initFunction,(string *)pvVar3);
          std::__cxx11::string::operator+=((string *)&initFunction,"Init");
          f = (cmLoadedCommand *)
              cmsys::DynamicLoader::GetSymbolAddress
                        ((LibraryHandle)err.field_2._8_8_,(string *)&initFunction);
        }
        bVar2 = f == (cmLoadedCommand *)0x0;
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_398,"Attempt to load command failed. No init function found.",
                     &local_399);
          cmCommand::SetError(&this->super_cmCommand,&local_398);
          std::__cxx11::string::~string((string *)&local_398);
          std::allocator<char>::~allocator((allocator<char> *)&local_399);
        }
        else {
          this_00 = (cmLoadedCommand *)operator_new(0x90);
          cmLoadedCommand::cmLoadedCommand(this_00);
          local_378 = this_00;
          (*(code *)f)(&this_00->info);
          this_01 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,0);
          cmState::AddScriptedCommand(this_01,pvVar3,&local_378->super_cmCommand);
        }
        this_local._7_1_ = !bVar2;
        std::__cxx11::string::~string((string *)&initFunction);
      }
    }
    std::__cxx11::string::~string((string *)local_150);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool cmLoadCommandCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.empty()) {
    return true;
  }

  // Construct a variable to report what file was loaded, if any.
  // Start by removing the definition in case of failure.
  std::string reportVar = "CMAKE_LOADED_COMMAND_";
  reportVar += args[0];
  this->Makefile->RemoveDefinition(reportVar);

  // the file must exist
  std::string moduleName =
    this->Makefile->GetRequiredDefinition("CMAKE_SHARED_MODULE_PREFIX");
  moduleName += "cm" + args[0];
  moduleName +=
    this->Makefile->GetRequiredDefinition("CMAKE_SHARED_MODULE_SUFFIX");

  // search for the file
  std::vector<std::string> path;
  for (unsigned int j = 1; j < args.size(); j++) {
    // expand variables
    std::string exp = args[j];
    cmSystemTools::ExpandRegistryValues(exp);

    // Glob the entry in case of wildcards.
    cmSystemTools::GlobDirs(exp, path);
  }

  // Try to find the program.
  std::string fullPath = cmSystemTools::FindFile(moduleName, path);
  if (fullPath == "") {
    std::ostringstream e;
    e << "Attempt to load command failed from file \"" << moduleName << "\"";
    this->SetError(e.str());
    return false;
  }

  // try loading the shared library / dll
  cmsys::DynamicLoader::LibraryHandle lib =
    cmDynamicLoader::OpenLibrary(fullPath.c_str());
  if (!lib) {
    std::string err = "Attempt to load the library ";
    err += fullPath + " failed.";
    const char* error = cmsys::DynamicLoader::LastError();
    if (error) {
      err += " Additional error info is:\n";
      err += error;
    }
    this->SetError(err);
    return false;
  }

  // Report what file was loaded for this command.
  this->Makefile->AddDefinition(reportVar, fullPath.c_str());

  // find the init function
  std::string initFuncName = args[0] + "Init";
  CM_INIT_FUNCTION initFunction =
    (CM_INIT_FUNCTION)cmsys::DynamicLoader::GetSymbolAddress(lib,
                                                             initFuncName);
  if (!initFunction) {
    initFuncName = "_";
    initFuncName += args[0];
    initFuncName += "Init";
    initFunction = (CM_INIT_FUNCTION)(
      cmsys::DynamicLoader::GetSymbolAddress(lib, initFuncName));
  }
  // if the symbol is found call it to set the name on the
  // function blocker
  if (initFunction) {
    // create a function blocker and set it up
    cmLoadedCommand* f = new cmLoadedCommand();
    (*initFunction)(&f->info);
    this->Makefile->GetState()->AddScriptedCommand(args[0], f);
    return true;
  }
  this->SetError("Attempt to load command failed. "
                 "No init function found.");
  return false;
}